

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyFindDocType(TidyDocImpl *doc)

{
  bool bVar1;
  Node *local_20;
  Node *local_18;
  Node *node;
  TidyDocImpl *doc_local;
  
  if (doc == (TidyDocImpl *)0x0) {
    local_20 = (Node *)0x0;
  }
  else {
    local_20 = (doc->root).content;
  }
  local_18 = local_20;
  while( true ) {
    bVar1 = false;
    if (local_18 != (Node *)0x0) {
      bVar1 = local_18->type != DocTypeTag;
    }
    if (!bVar1) break;
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

Node *TY_(FindDocType)( TidyDocImpl* doc )
{
    Node* node;
    for ( node = (doc ? doc->root.content : NULL);
          node && node->type != DocTypeTag; 
          node = node->next )
        /**/;
    return node;
}